

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvim_rpc.hpp
# Opt level: O3

void __thiscall
nvim::NvimRPC::
async_call<long,long,long,bool,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
          (NvimRPC *this,string *method,long *u,long *u_1,long *u_2,bool *u_3,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *u_4)

{
  ulong uVar1;
  uint16_t val;
  uint uVar2;
  long *__n;
  size_t __n_00;
  char d;
  Packer pk;
  sbuffer sbuf;
  undefined1 local_61;
  ulong local_60;
  packer<msgpack::v1::sbuffer> local_58;
  sbuffer local_50;
  bool *local_38;
  
  __n = u_1;
  local_38 = u_3;
  msgpack::v1::sbuffer::sbuffer(&local_50,0x2000);
  local_61 = 0x94;
  local_58.m_stream = &local_50;
  msgpack::v1::sbuffer::write(&local_50,(int)&local_61,(void *)0x1,(size_t)__n);
  local_61 = 0;
  msgpack::v1::sbuffer::write(&local_50,(int)&local_61,(void *)0x1,(size_t)__n);
  uVar1 = this->msgid_;
  __n_00 = uVar1 + 1;
  this->msgid_ = __n_00;
  if (uVar1 < 0x100) {
    if (uVar1 < 0x80) {
      local_61 = (char)uVar1;
      msgpack::v1::sbuffer::write(&local_50,(int)&local_61,(void *)0x1,__n_00);
    }
    else {
      local_61 = 0xcc;
      local_60 = CONCAT71(local_60._1_7_,(char)uVar1);
      msgpack::v1::sbuffer::write(&local_50,(int)&local_61,(void *)0x2,__n_00);
    }
  }
  else if (uVar1 < 0x10000) {
    local_61 = 0xcd;
    local_60 = CONCAT62(local_60._2_6_,(ushort)uVar1 << 8 | (ushort)uVar1 >> 8);
    msgpack::v1::sbuffer::write(&local_50,(int)&local_61,(void *)0x3,__n_00);
  }
  else {
    __n_00 = uVar1 >> 0x20;
    if (__n_00 == 0) {
      local_61 = 0xce;
      uVar2 = (uint)uVar1;
      local_60 = CONCAT44(local_60._4_4_,
                          uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
                          uVar2 << 0x18);
      msgpack::v1::sbuffer::write(&local_50,(int)&local_61,(void *)0x5,0);
    }
    else {
      local_61 = 0xcf;
      local_60 = uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 |
                 (uVar1 & 0xff0000000000) >> 0x18 | (uVar1 & 0xff00000000) >> 8 |
                 (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 | (uVar1 & 0xff00) << 0x28 |
                 uVar1 << 0x38;
      msgpack::v1::sbuffer::write(&local_50,(int)&local_61,(void *)0x9,__n_00);
    }
  }
  msgpack::v1::adaptor::pack<std::__cxx11::string,void>::operator()(&local_61,&local_58,method);
  local_61 = 0x95;
  msgpack::v1::sbuffer::write(local_58.m_stream,(int)&local_61,(void *)0x1,__n_00);
  detail::
  pack<long,long,long,bool,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_58,u,u_1,u_2,local_38,u_4);
  Socket::write(&this->socket_,(int)local_50.m_data,(void *)local_50.m_size,(size_t)u_2);
  free(local_50.m_data);
  return;
}

Assistant:

void NvimRPC::async_call(const std::string &method, const U&...u) {
    msgpack::sbuffer sbuf;
    detail::Packer pk(&sbuf);
    pk.pack_array(4) << (uint64_t)REQUEST
                     << msgid_++
                     << method;

    pk.pack_array(sizeof...(u));
    detail::pack(pk, u...);

    socket_.write(sbuf.data(), sbuf.size(), 5);
}